

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O1

void __thiscall thread_pool::wait_all(thread_pool *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->m_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  std::condition_variable::wait<thread_pool::wait_all()::_lambda()_1_>
            (&this->m_cvWait,&local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void wait_all() {
    std::unique_lock<std::mutex> lock(m_mutex);
    m_cvWait.wait(lock, [this]() -> bool {
                          return
                            !m_running ||
                            (m_work.empty() && m_doingWork == 0);
                        });
  }